

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DOMNodeImpl::lookupPrefix
          (DOMNodeImpl *this,XMLCh *namespaceURI,DOMElement *originalElement)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  DOMNodeImpl *currentNode;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNodeImpl *pDVar9;
  ulong uVar10;
  DOMNodeImpl *pDVar11;
  undefined2 *puVar12;
  undefined4 extraout_var_06;
  undefined2 *puVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  XMLCh *pXVar14;
  DOMNode *pDVar15;
  long *plVar16;
  long lVar17;
  DOMException *this_00;
  XMLCh *pXVar18;
  ulong uVar19;
  DOMNodeImpl *this_01;
  bool bVar20;
  bool bVar21;
  XMLCh *local_58;
  XMLCh *pXVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_07;
  
  do {
    currentNode = (DOMNodeImpl *)this->fContainingNode;
    iVar6 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
    pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar6);
    iVar6 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    local_58 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
    if (pXVar8 != (XMLCh *)0x0) {
      if (pXVar8 == namespaceURI) {
        bVar20 = true;
      }
      else {
        pXVar14 = namespaceURI;
        pXVar18 = pXVar8;
        if (namespaceURI == (XMLCh *)0x0) {
LAB_0027a780:
          bVar20 = *pXVar18 == L'\0';
        }
        else {
          do {
            XVar3 = *pXVar8;
            pXVar18 = pXVar14;
            if (XVar3 == L'\0') goto LAB_0027a780;
            pXVar8 = pXVar8 + 1;
            XVar4 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar3 == XVar4);
          bVar20 = false;
        }
      }
      if ((local_58 != (XMLCh *)0x0) && (bVar20)) {
        iVar6 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])(originalElement,local_58);
        pXVar8 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
        if (pXVar8 != (XMLCh *)0x0) {
          if (pXVar8 == namespaceURI) {
            return local_58;
          }
          pXVar14 = pXVar8;
          pXVar18 = namespaceURI;
          if (namespaceURI == (XMLCh *)0x0) {
LAB_0027a7d9:
            if (*pXVar8 == L'\0') {
              return local_58;
            }
          }
          else {
            do {
              pXVar8 = pXVar18;
              XVar3 = *pXVar14;
              if (XVar3 == L'\0') goto LAB_0027a7d9;
              pXVar14 = pXVar14 + 1;
              pXVar18 = pXVar8 + 1;
            } while (XVar3 == *pXVar8);
          }
        }
      }
    }
    this_01 = currentNode;
    iVar6 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar6 != '\0') {
      this_01 = currentNode;
      iVar6 = (*(code *)currentNode->fContainingNode[0xb]._vptr_DOMNode)();
      pDVar9 = (DOMNodeImpl *)CONCAT44(extraout_var_02,iVar6);
      if (pDVar9 == (DOMNodeImpl *)0x0) {
        bVar20 = true;
      }
      else {
        this_01 = pDVar9;
        iVar6 = (*(code *)pDVar9->fContainingNode[5]._vptr_DOMNode)();
        uVar10 = CONCAT44(extraout_var_03,iVar6);
        bVar20 = uVar10 == 0;
        if (!bVar20) {
          uVar19 = 0;
          do {
            iVar6 = (*(code *)pDVar9->fContainingNode[3]._vptr_DOMNode)(pDVar9,uVar19);
            pDVar11 = (DOMNodeImpl *)CONCAT44(extraout_var_04,iVar6);
            iVar6 = (*(code *)pDVar11->fContainingNode[0x17]._vptr_DOMNode)(pDVar11);
            puVar12 = (undefined2 *)CONCAT44(extraout_var_05,iVar6);
            iVar6 = (*(code *)pDVar11->fContainingNode[3]._vptr_DOMNode)(pDVar11);
            pXVar8 = (XMLCh *)CONCAT44(extraout_var_06,iVar6);
            this_01 = pDVar11;
            iVar6 = (*(code *)pDVar11->fContainingNode[0x16]._vptr_DOMNode)();
            puVar13 = (undefined2 *)CONCAT44(extraout_var_07,iVar6);
            bVar5 = true;
            if (puVar13 != (undefined2 *)0x0) {
              bVar21 = true;
              this_01 = (DOMNodeImpl *)&XMLUni::fgXMLNSURIName;
              if (puVar13 != &XMLUni::fgXMLNSURIName) {
                lVar17 = 0;
                do {
                  psVar1 = (short *)((long)puVar13 + lVar17);
                  if (*psVar1 == 0) {
                    bVar21 = *(short *)((long)&XMLUni::fgXMLNSURIName + lVar17) == 0;
                    goto LAB_0027a8ab;
                  }
                  psVar2 = (short *)((long)&XMLUni::fgXMLNSURIName + lVar17);
                  lVar17 = lVar17 + 2;
                } while (*psVar1 == *psVar2);
                bVar21 = false;
              }
LAB_0027a8ab:
              if ((puVar12 != (undefined2 *)0x0) && (bVar21)) {
                if (puVar12 == &XMLUni::fgXMLNSString) {
LAB_0027a8f1:
                  if (pXVar8 != namespaceURI) {
                    pXVar14 = namespaceURI;
                    if ((namespaceURI != (XMLCh *)0x0) && (pXVar8 != (XMLCh *)0x0)) {
                      do {
                        XVar3 = *pXVar8;
                        if (XVar3 == L'\0') goto LAB_0027a955;
                        pXVar8 = pXVar8 + 1;
                        XVar4 = *pXVar14;
                        pXVar14 = pXVar14 + 1;
                      } while (XVar3 == XVar4);
                      goto LAB_0027a9c0;
                    }
                    if (pXVar8 == (XMLCh *)0x0) {
                      if (namespaceURI == (XMLCh *)0x0) goto LAB_0027a960;
LAB_0027a955:
                      bVar21 = *pXVar14 == L'\0';
                    }
                    else {
                      bVar21 = *pXVar8 == L'\0';
                      if ((namespaceURI != (XMLCh *)0x0) && (*pXVar8 == L'\0')) goto LAB_0027a955;
                    }
                    if (!bVar21) goto LAB_0027a9c0;
                  }
LAB_0027a960:
                  iVar6 = (*(code *)pDVar11->fContainingNode[0x18]._vptr_DOMNode)(pDVar11);
                  this_01 = (DOMNodeImpl *)originalElement;
                  iVar7 = (*(originalElement->super_DOMNode)._vptr_DOMNode[0x25])
                                    (originalElement,(XMLCh *)CONCAT44(extraout_var_08,iVar6));
                  pXVar8 = (XMLCh *)CONCAT44(extraout_var_09,iVar7);
                  if (pXVar8 != (XMLCh *)0x0) {
                    if (pXVar8 == namespaceURI) {
LAB_0027a9b8:
                      bVar5 = false;
                      local_58 = (XMLCh *)CONCAT44(extraout_var_08,iVar6);
                    }
                    else {
                      pXVar14 = pXVar8;
                      pXVar18 = namespaceURI;
                      if (namespaceURI == (XMLCh *)0x0) {
LAB_0027a9b2:
                        if (*pXVar8 == L'\0') goto LAB_0027a9b8;
                      }
                      else {
                        do {
                          pXVar8 = pXVar18;
                          XVar3 = *pXVar14;
                          if (XVar3 == L'\0') goto LAB_0027a9b2;
                          pXVar14 = pXVar14 + 1;
                          pXVar18 = pXVar8 + 1;
                        } while (XVar3 == *pXVar8);
                      }
                    }
                  }
                }
                else {
                  lVar17 = 0;
                  do {
                    psVar1 = (short *)((long)puVar12 + lVar17);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)&XMLUni::fgXMLNSString + lVar17) == 0) goto LAB_0027a8f1;
                      break;
                    }
                    psVar2 = (short *)((long)&XMLUni::fgXMLNSString + lVar17);
                    lVar17 = lVar17 + 2;
                  } while (*psVar1 == *psVar2);
                }
              }
            }
LAB_0027a9c0:
            if (!bVar5) break;
            uVar19 = uVar19 + 1;
            bVar20 = uVar10 <= uVar19;
          } while (uVar19 != uVar10);
        }
      }
      if (!bVar20) {
        return local_58;
      }
    }
    pDVar15 = getElementAncestor(this_01,(DOMNode *)currentNode);
    if (pDVar15 == (DOMNode *)0x0) {
      return (XMLCh *)0x0;
    }
    plVar16 = (long *)__dynamic_cast(pDVar15,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                     0xfffffffffffffffe);
    if ((plVar16 == (long *)0x0) || (lVar17 = (**(code **)(*plVar16 + 0x10))(plVar16), lVar17 == 0))
    {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
    this = (DOMNodeImpl *)(**(code **)(*plVar16 + 0x10))(plVar16);
  } while( true );
}

Assistant:

const XMLCh* DOMNodeImpl::lookupPrefix(const XMLCh* const namespaceURI, DOMElement *originalElement) const {
    const DOMNode *thisNode = getContainingNode();

    const XMLCh* ns = thisNode->getNamespaceURI();
    // REVISIT: if no prefix is available is it null or empty string, or
    //          could be both?
    const XMLCh* prefix = thisNode->getPrefix();

    if (ns != 0 && XMLString::equals(ns,namespaceURI) && prefix != 0) {
        const XMLCh* foundNamespace =  originalElement->lookupNamespaceURI(prefix);
        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
            return prefix;
        }
    }
    if (thisNode->hasAttributes()) {
        DOMNamedNodeMap *nodeMap = thisNode->getAttributes();

        if(nodeMap != 0) {
            XMLSize_t length = nodeMap->getLength();

            for (XMLSize_t i = 0;i < length;i++) {
                DOMNode *attr = nodeMap->item(i);
                const XMLCh* attrPrefix = attr->getPrefix();
                const XMLCh* value = attr->getNodeValue();

                ns = attr->getNamespaceURI();

                if (ns != 0 && XMLString::equals(ns, XMLUni::fgXMLNSURIName)) {
                    // DOM Level 2 nodes
                    if ((attrPrefix != 0 && XMLString::equals(attrPrefix, XMLUni::fgXMLNSString)) &&
                        XMLString::equals(value, namespaceURI)) {
                        const XMLCh* localname= attr->getLocalName();
                        const XMLCh* foundNamespace = originalElement->lookupNamespaceURI(localname);
                        if (foundNamespace != 0 && XMLString::equals(foundNamespace, namespaceURI)) {
                            return localname;
                        }
                    }
                }
            }
        }
    }
    DOMNode *ancestor = getElementAncestor(thisNode);
    if (ancestor != 0) {
        return castToNodeImpl(ancestor)->lookupPrefix(namespaceURI, originalElement);
    }
    return 0;
}